

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.c
# Opt level: O3

void save_png(gdImagePtr im,char *filename)

{
  FILE *__stream;
  
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    puts("No PNG support. Cannot save image.");
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"Can\'t save png image %s\n",filename);
  return;
}

Assistant:

void save_png(gdImagePtr im, const char *filename)
{
	FILE *fp;
	fp = fopen(filename, "wb");
	if (!fp) {
		fprintf(stderr, "Can't save png image %s\n", filename);
		return;
	}
#ifdef HAVE_LIBPNG
	gdImagePng(im, fp);
#else
	printf("No PNG support. Cannot save image.\n");
#endif
	fclose(fp);
}